

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

bool __thiscall QGraphicsView::viewportEvent(QGraphicsView *this,QEvent *event)

{
  ushort uVar1;
  QGraphicsViewPrivate *d;
  QGraphicsScenePrivate *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QWidget *pQVar6;
  Data *pDVar7;
  QMetaObject *pQVar8;
  QWidget *pQVar9;
  Type TVar10;
  QObject *pQVar11;
  long in_FS_OFFSET;
  QPointF QVar12;
  QObject local_60 [8];
  QPointF local_58;
  undefined1 local_48 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  d = *(QGraphicsViewPrivate **)(this + 8);
  pDVar7 = (d->scene).wp.d;
  if (((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) ||
     (pQVar11 = (d->scene).wp.value, pQVar11 == (QObject *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      bVar3 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
      return bVar3;
    }
    goto LAB_00634298;
  }
  uVar1 = *(ushort *)(event + 8);
  if (0xc1 < uVar1) {
    if (uVar1 - 0xc2 < 3) {
      if ((*(byte *)(*(long *)(this + 0x20) + 8) & 1) == 0) {
        if ((*(int *)(pDVar7 + 4) == 0) || ((d->field_0x300 & 1) == 0)) {
          event[0xc] = (QEvent)0x0;
        }
        else {
          pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          *(QWidget **)(event + 0x40) = pQVar6;
          QGraphicsViewPrivate::translateTouchEvent(d,(QTouchEvent *)event);
          pDVar7 = (d->scene).wp.d;
          if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
            pQVar11 = (QObject *)0x0;
          }
          else {
            pQVar11 = (d->scene).wp.value;
          }
          QCoreApplication::sendEvent(pQVar11,event);
        }
        goto LAB_00634207;
      }
    }
    else {
      if ((uVar1 != 0xc6) && (uVar1 != 0xca)) goto switchD_00633d79_caseD_d;
      if ((*(byte *)(*(long *)(this + 0x20) + 8) & 1) == 0) {
        bVar3 = true;
        if ((*(int *)(pDVar7 + 4) != 0) && ((d->field_0x300 & 1) != 0)) {
          pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          QGestureEvent::setWidget((QGestureEvent *)event,pQVar6);
          pDVar7 = (d->scene).wp.d;
          if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
            pQVar11 = (QObject *)0x0;
          }
          else {
            pQVar11 = (d->scene).wp.value;
          }
          QCoreApplication::sendEvent(pQVar11,event);
        }
        goto LAB_00634227;
      }
    }
    bVar3 = false;
    goto LAB_00634227;
  }
  switch(uVar1) {
  case 10:
  case 0x18:
    if (*(int *)(pDVar7 + 4) == 0) {
      pQVar11 = (QObject *)0x0;
    }
    goto LAB_00634212;
  case 0xb:
    pQVar6 = QApplication::activePopupWidget();
    if (pQVar6 == (QWidget *)0x0) {
LAB_006340a9:
      pQVar6 = QApplication::activeModalWidget();
      if (pQVar6 != (QWidget *)0x0) {
        pQVar6 = QApplication::activeModalWidget();
        pQVar9 = QWidget::window((QWidget *)this);
        if (pQVar6 != pQVar9) goto LAB_006340dd;
      }
      pQVar6 = QApplication::activeWindow();
      pQVar9 = QWidget::window((QWidget *)this);
      if (pQVar6 != pQVar9) goto LAB_006340dd;
    }
    else {
      pQVar6 = QApplication::activePopupWidget();
      pQVar9 = QWidget::window((QWidget *)this);
      if (pQVar6 == pQVar9) goto LAB_006340a9;
LAB_006340dd:
      if (((d->scene).wp.d != (Data *)0x0) &&
         (pQVar2 = *(QGraphicsScenePrivate **)((d->scene).wp.value + 8),
         (pQVar2->popupWidgets).d.size != 0)) {
        QGraphicsScenePrivate::removePopup(pQVar2,*(pQVar2->popupWidgets).d.ptr,false);
      }
    }
    d->field_0x300 = d->field_0x300 & 0xf7;
    local_38.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneEvent::QGraphicsSceneEvent((QGraphicsSceneEvent *)local_48,GraphicsSceneLeave);
    pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_48,pQVar6);
    pDVar7 = (d->scene).wp.d;
    if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
      pQVar11 = (QObject *)0x0;
    }
    else {
      pQVar11 = (d->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar11,(QEvent *)local_48);
    (**(code **)(*(long *)event + 0x10))(event,local_48[0xc]);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_48);
    break;
  case 0xc:
    d->field_0x301 = d->field_0x301 & 0xef;
    (d->dirtyScrollOffset).xp = 0;
    (d->dirtyScrollOffset).yp = 0;
    if ((*(int *)(pDVar7 + 4) != 0) && (d->updateSceneSlotReimplementedChecked == false)) {
      d->updateSceneSlotReimplementedChecked = true;
      pQVar8 = (QMetaObject *)(*(code *)**(undefined8 **)this)(this);
      if (pQVar8 != &staticMetaObject) {
        iVar4 = QMetaObject::indexOfSlot((char *)pQVar8);
        iVar5 = QMetaObject::indexOfSlot((char *)&staticMetaObject);
        if (iVar4 != iVar5) {
          pDVar7 = (d->scene).wp.d;
          if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
            pQVar11 = (QObject *)0x0;
          }
          else {
            pQVar11 = (d->scene).wp.value;
          }
          QObject::connect(local_60,(char *)pQVar11,(QObject *)"2changed(QList<QRectF>)",
                           (char *)this,0x6f3cf0);
          QMetaObject::Connection::~Connection((Connection *)local_60);
        }
      }
    }
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    break;
  case 0x11:
    if ((*(int *)(pDVar7 + 4) != 0) && (bVar3 = QWidget::isActiveWindow((QWidget *)this), bVar3)) {
      TVar10 = WindowActivate;
LAB_00633fc3:
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)local_48,TVar10);
      pDVar7 = (d->scene).wp.d;
      if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
        pQVar11 = (QObject *)0x0;
      }
      else {
        pQVar11 = (d->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar11,(QEvent *)local_48);
      QEvent::~QEvent((QEvent *)local_48);
    }
    break;
  case 0x12:
    if (((event[0xb] == (QEvent)0x0) && (*(int *)(pDVar7 + 4) != 0)) &&
       (bVar3 = QWidget::isActiveWindow((QWidget *)this), bVar3)) {
      TVar10 = WindowDeactivate;
      goto LAB_00633fc3;
    }
    break;
  case 0x19:
    pQVar2 = *(QGraphicsScenePrivate **)(pQVar11 + 8);
    if ((pQVar2->popupWidgets).d.size != 0) {
      QGraphicsScenePrivate::removePopup(pQVar2,*(pQVar2->popupWidgets).d.ptr,false);
      pDVar7 = (d->scene).wp.d;
      pQVar11 = (QObject *)0x0;
      if (pDVar7 == (Data *)0x0) goto LAB_00634212;
    }
    if (*(int *)(pDVar7 + 4) == 0) {
      pQVar11 = (QObject *)0x0;
    }
    else {
      pQVar11 = (d->scene).wp.value;
    }
LAB_00634212:
    QCoreApplication::sendEvent(pQVar11,event);
    break;
  default:
    if (uVar1 == 0x6e) {
      local_38.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneHelpEvent::QGraphicsSceneHelpEvent
                ((QGraphicsSceneHelpEvent *)local_48,GraphicsSceneHelp);
      pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_48,pQVar6);
      QGraphicsSceneHelpEvent::setScreenPos
                ((QGraphicsSceneHelpEvent *)local_48,(QPoint *)(event + 0x18));
      QVar12 = mapToScene(this,(QPoint *)(event + 0x10));
      local_58.yp = QVar12.yp;
      local_58.xp = QVar12.xp;
      QGraphicsSceneHelpEvent::setScenePos((QGraphicsSceneHelpEvent *)local_48,&local_58);
      pDVar7 = (d->scene).wp.d;
      if ((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) {
        pQVar11 = (QObject *)0x0;
      }
      else {
        pQVar11 = (d->scene).wp.value;
      }
      QCoreApplication::sendEvent(pQVar11,(QEvent *)local_48);
      (**(code **)(*(long *)event + 0x10))(event,local_48[0xc]);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_48);
LAB_00634207:
      bVar3 = true;
      goto LAB_00634227;
    }
  }
switchD_00633d79_caseD_d:
  bVar3 = QAbstractScrollArea::viewportEvent((QAbstractScrollArea *)this,event);
LAB_00634227:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
LAB_00634298:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsView::viewportEvent(QEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene)
        return QAbstractScrollArea::viewportEvent(event);

    switch (event->type()) {
    case QEvent::Enter:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowActivate:
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::WindowDeactivate:
        // ### This is a temporary fix for until we get proper mouse
        // grab events. mouseGrabberItem should be set to 0 if we lose
        // the mouse grab.
        // Remove all popups when the scene loses focus.
        if (!d->scene->d_func()->popupWidgets.isEmpty())
            d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        QCoreApplication::sendEvent(d->scene, event);
        break;
    case QEvent::Show:
        if (d->scene && isActiveWindow()) {
            QEvent windowActivate(QEvent::WindowActivate);
            QCoreApplication::sendEvent(d->scene, &windowActivate);
        }
        break;
    case QEvent::Hide:
        // spontaneous event will generate a WindowDeactivate.
        if (!event->spontaneous() && d->scene && isActiveWindow()) {
            QEvent windowDeactivate(QEvent::WindowDeactivate);
            QCoreApplication::sendEvent(d->scene, &windowDeactivate);
        }
        break;
    case QEvent::Leave: {
        // ### This is a temporary fix for until we get proper mouse grab
        // events. activeMouseGrabberItem should be set to 0 if we lose the
        // mouse grab.
        if ((QApplication::activePopupWidget() && QApplication::activePopupWidget() != window())
            || (QApplication::activeModalWidget() && QApplication::activeModalWidget() != window())
            || (QApplication::activeWindow() != window())) {
            if (!d->scene->d_func()->popupWidgets.isEmpty())
                d->scene->d_func()->removePopup(d->scene->d_func()->popupWidgets.constFirst());
        }
        d->useLastMouseEvent = false;
        QGraphicsSceneEvent leaveEvent(QEvent::GraphicsSceneLeave);
        leaveEvent.setWidget(viewport());
        QCoreApplication::sendEvent(d->scene, &leaveEvent);
        event->setAccepted(leaveEvent.isAccepted());
        break;
    }
#if QT_CONFIG(tooltip)
    case QEvent::ToolTip: {
        QHelpEvent *toolTip = static_cast<QHelpEvent *>(event);
        QGraphicsSceneHelpEvent helpEvent(QEvent::GraphicsSceneHelp);
        helpEvent.setWidget(viewport());
        helpEvent.setScreenPos(toolTip->globalPos());
        helpEvent.setScenePos(mapToScene(toolTip->pos()));
        QCoreApplication::sendEvent(d->scene, &helpEvent);
        toolTip->setAccepted(helpEvent.isAccepted());
        return true;
    }
#endif
    case QEvent::Paint:
        // Reset full update
        d->fullUpdatePending = false;
        d->dirtyScrollOffset = QPoint();
        if (d->scene) {
            // Check if this view reimplements the updateScene slot; if it
            // does, we can't do direct update delivery and have to fall back
            // to connecting the changed signal.
            if (!d->updateSceneSlotReimplementedChecked) {
                d->updateSceneSlotReimplementedChecked = true;
                const QMetaObject *mo = metaObject();
                if (mo != &QGraphicsView::staticMetaObject) {
                    if (mo->indexOfSlot("updateScene(QList<QRectF>)")
                        != QGraphicsView::staticMetaObject.indexOfSlot("updateScene(QList<QRectF>)")) {
                        connect(d->scene, SIGNAL(changed(QList<QRectF>)),
                                this, SLOT(updateScene(QList<QRectF>)));
                    }
                }
            }
        }
        break;
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            // Convert and deliver the touch event to the scene.
            QTouchEvent *touchEvent = static_cast<QTouchEvent *>(event);
            QMutableTouchEvent::setTarget(touchEvent, viewport());
            QGraphicsViewPrivate::translateTouchEvent(d, touchEvent);
            QCoreApplication::sendEvent(d->scene, touchEvent);
        } else {
            event->ignore();
        }

        return true;
    }
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    case QEvent::GestureOverride:
    {
        if (!isEnabled())
            return false;

        if (d->scene && d->sceneInteractionAllowed) {
            QGestureEvent *gestureEvent = static_cast<QGestureEvent *>(event);
            gestureEvent->setWidget(viewport());
            QCoreApplication::sendEvent(d->scene, gestureEvent);
        }
        return true;
    }
#endif // QT_NO_GESTURES
    default:
        break;
    }

    return QAbstractScrollArea::viewportEvent(event);
}